

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_audio_buffer_ref_read_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,void *pFramesOut,ma_uint64 frameCount,
                    ma_bool32 loop)

{
  ma_uint64 mVar1;
  ma_uint64 mVar2;
  ulong uVar3;
  void *__src;
  void *__dest;
  ulong uVar4;
  ulong uVar5;
  
  if (frameCount == 0 || pAudioBufferRef == (ma_audio_buffer_ref *)0x0) {
    uVar4 = 0;
  }
  else {
    mVar2 = pAudioBufferRef->cursor;
    mVar1 = pAudioBufferRef->sizeInFrames;
    uVar4 = 0;
    do {
      uVar5 = frameCount - uVar4;
      if (mVar1 - mVar2 <= frameCount - uVar4) {
        uVar5 = mVar1 - mVar2;
      }
      if (pFramesOut != (void *)0x0) {
        uVar3 = (ulong)(*(int *)(&DAT_0017b4a0 + (ulong)pAudioBufferRef->format * 4) *
                       pAudioBufferRef->channels);
        __dest = (void *)(uVar4 * uVar3 + (long)pFramesOut);
        __src = (void *)(mVar2 * uVar3 + (long)pAudioBufferRef->pData);
        if (__dest != __src) {
          memcpy(__dest,__src,uVar3 * uVar5);
          mVar2 = pAudioBufferRef->cursor;
          mVar1 = pAudioBufferRef->sizeInFrames;
        }
      }
      uVar4 = uVar4 + uVar5;
      mVar2 = mVar2 + uVar5;
      pAudioBufferRef->cursor = mVar2;
      if (mVar2 == mVar1) {
        if (loop == 0) {
          return uVar4;
        }
        pAudioBufferRef->cursor = 0;
        mVar2 = 0;
      }
    } while (uVar4 < frameCount);
  }
  return uVar4;
}

Assistant:

MA_API ma_uint64 ma_audio_buffer_ref_read_pcm_frames(ma_audio_buffer_ref* pAudioBufferRef, void* pFramesOut, ma_uint64 frameCount, ma_bool32 loop)
{
    ma_uint64 totalFramesRead = 0;

    if (pAudioBufferRef == NULL) {
        return 0;
    }

    if (frameCount == 0) {
        return 0;
    }

    while (totalFramesRead < frameCount) {
        ma_uint64 framesAvailable = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
        ma_uint64 framesRemaining = frameCount - totalFramesRead;
        ma_uint64 framesToRead;

        framesToRead = framesRemaining;
        if (framesToRead > framesAvailable) {
            framesToRead = framesAvailable;
        }

        if (pFramesOut != NULL) {
            ma_copy_pcm_frames(ma_offset_ptr(pFramesOut, totalFramesRead * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels)), ma_offset_ptr(pAudioBufferRef->pData, pAudioBufferRef->cursor * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels)), framesToRead, pAudioBufferRef->format, pAudioBufferRef->channels);
        }

        totalFramesRead += framesToRead;

        pAudioBufferRef->cursor += framesToRead;
        if (pAudioBufferRef->cursor == pAudioBufferRef->sizeInFrames) {
            if (loop) {
                pAudioBufferRef->cursor = 0;
            } else {
                break;  /* We've reached the end and we're not looping. Done. */
            }
        }

        MA_ASSERT(pAudioBufferRef->cursor < pAudioBufferRef->sizeInFrames);
    }

    return totalFramesRead;
}